

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

bool JsrtDebugUtils::HasProperty
               (DynamicObject *object,JsrtDebugPropertyId propertyId,ScriptContext *scriptContext)

{
  char16 *this;
  ScriptContext *instance;
  PropertyId propertyId_00;
  BOOL BVar1;
  char16 *string;
  size_t sVar2;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  char16 *local_28;
  char16 *propertyName;
  ScriptContext *scriptContext_local;
  DynamicObject *object_local;
  JsrtDebugPropertyId propertyId_local;
  
  propertyRecord._4_4_ = propertyId._value;
  propertyName = (char16 *)scriptContext;
  scriptContext_local = (ScriptContext *)object;
  object_local._0_4_ = propertyId._value;
  string = GetDebugPropertyName(propertyId);
  this = propertyName;
  local_28 = string;
  sVar2 = PAL_wcslen(string);
  Js::ScriptContext::FindPropertyRecord((ScriptContext *)this,string,(int)sVar2,&local_38);
  instance = scriptContext_local;
  if (local_38 == (PropertyRecord *)0x0) {
    object_local._7_1_ = false;
  }
  else {
    propertyId_00 = Js::PropertyRecord::GetPropertyId(local_38);
    BVar1 = Js::JavascriptOperators::HasProperty((RecyclableObject *)instance,propertyId_00);
    object_local._7_1_ = BVar1 != 0;
  }
  return object_local._7_1_;
}

Assistant:

bool JsrtDebugUtils::HasProperty(Js::DynamicObject * object, JsrtDebugPropertyId propertyId, Js::ScriptContext * scriptContext)
{
    const char16* propertyName = GetDebugPropertyName(propertyId);

    const Js::PropertyRecord* propertyRecord;
    scriptContext->FindPropertyRecord(propertyName, static_cast<int>(wcslen(propertyName)), &propertyRecord);

    if (propertyRecord == nullptr)
    {
        // No property record exists, there must be no property with that name in the script context.
        return false;
    }

    return !!Js::JavascriptOperators::HasProperty(object, propertyRecord->GetPropertyId());
}